

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O0

void appendAsUtf8(uint32_t code,string *outUtf8String)

{
  byte bVar1;
  string *outUtf8String_local;
  uint32_t code_local;
  
  bVar1 = (byte)code;
  if (code < 0x80) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,bVar1 & 0x7f);
  }
  else if (code < 0x800) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,((byte)(code >> 6) & 0x1f) - 0x40);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,(bVar1 & 0x3f) + 0x80);
  }
  else if (code < 0x10000) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,((byte)(code >> 0xc) & 0xf) - 0x20);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,((byte)(code >> 6) & 0x3f) + 0x80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,(bVar1 & 0x3f) + 0x80);
  }
  else if (code < 0x110000) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,((byte)(code >> 0x12) & 7) - 0x10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,((byte)(code >> 0xc) & 0x3f) + 0x80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,((byte)(code >> 6) & 0x3f) + 0x80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,(bVar1 & 0x3f) + 0x80);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (outUtf8String,'?');
  }
  return;
}

Assistant:

static void appendAsUtf8(uint32_t code, std::string &outUtf8String) {
  if (code < 0x80) {
    outUtf8String.push_back(static_cast<char>(code & 0x7F));
  } else if (code < 0x800) {
    outUtf8String.push_back(static_cast<char>(0xC0 + ((code >> 6) & 0x1F)));
    outUtf8String.push_back(static_cast<char>(0x80 + (code & 0x3F)));
  } else if (code < 0x10000) {
    outUtf8String.push_back(static_cast<char>(0xE0 + ((code >> 12) & 0x0F)));
    outUtf8String.push_back(static_cast<char>(0x80 + ((code >> 6) & 0x3F)));
    outUtf8String.push_back(static_cast<char>(0x80 + (code & 0x3F)));
  } else if (code < 0x110000) {
    outUtf8String.push_back(static_cast<char>(0xF0 + ((code >> 18) & 0x07)));
    outUtf8String.push_back(static_cast<char>(0x80 + ((code >> 12) & 0x3F)));
    outUtf8String.push_back(static_cast<char>(0x80 + ((code >> 6) & 0x3F)));
    outUtf8String.push_back(static_cast<char>(0x80 + (code & 0x3F)));
  } else {
    outUtf8String.push_back('?');
  }
}